

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

void __thiscall
apngasm_cli::Options::putHelpTo(Options *this,basic_ostream<char,_std::char_traits<char>_> *out)

{
  void *this_00;
  ostream *this_01;
  basic_ostream<char,_std::char_traits<char>_> *out_local;
  Options *this_local;
  
  putVersionTo(this,out);
  std::operator<<(out,
                  "===============================================================================\n\n"
                 );
  std::operator<<(out,
                  "ALLOWED OPTIONS\n-------------------------------------------------------------------------------\n"
                 );
  this_00 = (void *)boost::program_options::operator<<(out,&this->visible_opts);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  this_01 = std::operator<<(out,
                            "EXAMPLE\n-------------------------------------------------------------------------------\n\nAssemble an APNG:\n\n    apngasm -o outfile.png frame1.png frame2.png frame3.png [options]\n    apngasm -o outfile.png frame*.png [options]\n\nAssemble an APNG with specific frame delays in miliseconds:\n\n    apngasm -o outfile.png frame1.png 200 frame2.png 100 [options]\n\nAssemble an APNG with specific frame delays in fractions of a second:\n\n    apngasm -o outfile.png frame1.png 1:2 frame2.png 3:5 [options]\n\nDisassemble an APNG file into frames and JSON/XML directive files:\n\n    apngasm -o output_dir -D apng_file.png\n"
                           );
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Options::putHelpTo(std::basic_ostream<char> &out) const {
  putVersionTo(out);
  out << "====================================================================="
         "==========\n\n";
  out << ("ALLOWED OPTIONS\n"
          "--------------------------------------------------------------------"
          "-----------\n");

  out << visible_opts << std::endl;
  out << ("EXAMPLE\n"
          "--------------------------------------------------------------------"
          "-----------\n"
          "\nAssemble an APNG:\n\n"
          "    apngasm -o outfile.png frame1.png frame2.png frame3.png "
          "[options]\n"
          "    apngasm -o outfile.png frame*.png [options]\n"
          "\nAssemble an APNG with specific frame delays in miliseconds:\n\n"
          "    apngasm -o outfile.png frame1.png 200 frame2.png 100 [options]\n"
          "\nAssemble an APNG with specific frame delays in fractions of a "
          "second:\n\n"
          "    apngasm -o outfile.png frame1.png 1:2 frame2.png 3:5 [options]\n"
          "\nDisassemble an APNG file into frames and JSON/XML directive "
          "files:\n\n"
          "    apngasm -o output_dir -D apng_file.png\n")
      << std::endl;
}